

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImDrawList::AddDrawCmd(ImDrawList *this)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  ImDrawCmd *pIVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  long lVar9;
  ImVec4 *pIVar10;
  ImDrawCmd *__dest;
  int iVar11;
  int iVar12;
  void *pvVar13;
  
  lVar9 = (long)(this->_ClipRectStack).Size;
  pIVar10 = (this->_ClipRectStack).Data + lVar9 + -1;
  if (lVar9 == 0) {
    pIVar10 = &this->_Data->ClipRectFullscreen;
  }
  fVar5 = pIVar10->x;
  fVar6 = pIVar10->y;
  fVar7 = pIVar10->z;
  fVar8 = pIVar10->w;
  lVar9 = (long)(this->_TextureIdStack).Size;
  if (lVar9 == 0) {
    pvVar13 = (void *)0x0;
  }
  else {
    pvVar13 = (this->_TextureIdStack).Data[lVar9 + -1];
  }
  if ((fVar5 <= fVar7) && (fVar6 <= fVar8)) {
    uVar1 = (this->IdxBuffer).Size;
    uVar2 = this->_VtxCurrentOffset;
    iVar12 = (this->CmdBuffer).Size;
    iVar3 = (this->CmdBuffer).Capacity;
    if (iVar12 == iVar3) {
      iVar12 = iVar12 + 1;
      if (iVar3 == 0) {
        iVar11 = 8;
      }
      else {
        iVar11 = iVar3 / 2 + iVar3;
      }
      if (iVar12 < iVar11) {
        iVar12 = iVar11;
      }
      if (iVar3 < iVar12) {
        __dest = (ImDrawCmd *)ImGui::MemAlloc((long)iVar12 * 0x38);
        pIVar4 = (this->CmdBuffer).Data;
        if (pIVar4 != (ImDrawCmd *)0x0) {
          memcpy(__dest,pIVar4,(long)(this->CmdBuffer).Size * 0x38);
          ImGui::MemFree((this->CmdBuffer).Data);
        }
        (this->CmdBuffer).Data = __dest;
        (this->CmdBuffer).Capacity = iVar12;
      }
    }
    pIVar4 = (this->CmdBuffer).Data;
    iVar12 = (this->CmdBuffer).Size;
    pIVar4[iVar12].ElemCount = 0;
    pIVar10 = &pIVar4[iVar12].ClipRect;
    pIVar10->x = fVar5;
    pIVar10->y = fVar6;
    pIVar10->z = fVar7;
    pIVar10->w = fVar8;
    pIVar4[iVar12].TextureId = pvVar13;
    pIVar4[iVar12].VtxOffset = uVar2;
    pIVar4[iVar12].IdxOffset = uVar1;
    pIVar4[iVar12].UserCallback = (ImDrawCallback)0x0;
    (&pIVar4[iVar12].UserCallback)[1] = (ImDrawCallback)0x0;
    (this->CmdBuffer).Size = (this->CmdBuffer).Size + 1;
    return;
  }
  __assert_fail("draw_cmd.ClipRect.x <= draw_cmd.ClipRect.z && draw_cmd.ClipRect.y <= draw_cmd.ClipRect.w"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_draw.cpp"
                ,0x1af,"void ImDrawList::AddDrawCmd()");
}

Assistant:

void ImDrawList::AddDrawCmd()
{
    ImDrawCmd draw_cmd;
    draw_cmd.ClipRect = GetCurrentClipRect();
    draw_cmd.TextureId = GetCurrentTextureId();
    draw_cmd.VtxOffset = _VtxCurrentOffset;
    draw_cmd.IdxOffset = IdxBuffer.Size;

    IM_ASSERT(draw_cmd.ClipRect.x <= draw_cmd.ClipRect.z && draw_cmd.ClipRect.y <= draw_cmd.ClipRect.w);
    CmdBuffer.push_back(draw_cmd);
}